

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

void duckdb::DateTruncFunction<duckdb::date_t,duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  uint *puVar1;
  byte bVar2;
  reference left;
  reference right;
  NotImplementedException *this;
  uint *puVar3;
  code *local_50 [2];
  undefined1 local_40 [16];
  
  left = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  right = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  if (*left != (value_type)0x2) {
    BinaryExecutor::
    ExecuteSwitch<duckdb::string_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
              (left,right,result,*(idx_t *)(args + 0x18),false);
    return;
  }
  if ((*(byte **)(left + 0x28) != (byte *)0x0) && ((**(byte **)(left + 0x28) & 1) == 0)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  puVar1 = *(uint **)(left + 0x20);
  if ((ulong)*puVar1 < 0xd) {
    puVar3 = puVar1 + 1;
  }
  else {
    puVar3 = *(uint **)(puVar1 + 2);
  }
  local_50[0] = (code *)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,puVar3,(ulong)*puVar1 + (long)puVar3);
  bVar2 = duckdb::GetDatePartSpecifier((string *)local_50);
  if (local_50[0] != (code *)local_40) {
    operator_delete(local_50[0]);
  }
  if (bVar2 < 0x18) {
    switch(bVar2) {
    case 0:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>;
      break;
    case 1:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::MonthOperator>;
      break;
    default:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::DayOperator>;
      break;
    case 3:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::DecadeOperator>;
      break;
    case 4:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::CenturyOperator>;
      break;
    case 5:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::MillenniumOperator>
      ;
      break;
    case 6:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::MicrosecondOperator>
      ;
      break;
    case 7:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::MillisecondOperator>
      ;
      break;
    case 8:
    case 0x16:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::SecondOperator>;
      break;
    case 9:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::MinuteOperator>;
      break;
    case 10:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::HourOperator>;
      break;
    case 0xd:
    case 0x11:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::WeekOperator>;
      break;
    case 0xe:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::ISOYearOperator>;
      break;
    case 0xf:
      local_50[0] = DateTrunc::
                    UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::QuarterOperator>;
      break;
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
      goto switchD_005be839_caseD_12;
    }
    UnaryExecutor::
    ExecuteStandard<duckdb::date_t,duckdb::date_t,duckdb::UnaryLambdaWrapper,duckdb::date_t(*)(duckdb::date_t)>
              (right,result,*(idx_t *)(args + 0x18),local_50,false,CAN_THROW_RUNTIME_ERROR);
    return;
  }
switchD_005be839_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50[0] = (code *)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Specifier type not implemented for DATETRUNC","");
  duckdb::NotImplementedException::NotImplementedException(this,(string *)local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void DateTruncFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &part_arg = args.data[0];
	auto &date_arg = args.data[1];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateTruncUnaryExecutor<TA, TR>(type, date_arg, result, args.size());
		}
	} else {
		BinaryExecutor::ExecuteStandard<string_t, TA, TR, DateTruncBinaryOperator>(part_arg, date_arg, result,
		                                                                           args.size());
	}
}